

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O3

long __thiscall gl4cts::anon_unknown_0::BasicStdLayoutBase3CS::Run(BasicStdLayoutBase3CS *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  GLuint program;
  GLint location;
  undefined4 extraout_var;
  size_t sVar4;
  long lVar5;
  void *pvVar6;
  void *pvVar7;
  void **ppvVar8;
  CallLogWrapper *this_00;
  void *pvVar9;
  byte bVar10;
  ulong uVar11;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> in_data [2];
  stringstream ss;
  allocator_type local_219;
  string local_218;
  void *local_1f8;
  long lStack_1f0;
  undefined8 local_1e8;
  void *pvStack_1e0;
  long local_1d8;
  undefined8 uStack_1d0;
  GLuint *local_1c8;
  CallLogWrapper *local_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  char *__s;
  
  local_1d8 = 0;
  uStack_1d0 = 0;
  local_1e8 = 0;
  pvStack_1e0 = (void *)0x0;
  local_1f8 = (void *)0x0;
  lStack_1f0 = 0;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(local_size_x = 1) in;\n",0x1d);
  ppvVar8 = &local_1f8;
  iVar3 = (*(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
            _vptr_GLWrapper[9])(this,ppvVar8);
  __s = (char *)CONCAT44(extraout_var,iVar3);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(ostream *)local_1a8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
  }
  else {
    sVar4 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar4);
  }
  std::__cxx11::stringbuf::str();
  program = ShaderStorageBufferObjectBase::CreateProgramCS
                      (&this->super_ShaderStorageBufferObjectBase,&local_218);
  this->m_program = program;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    program = this->m_program;
  }
  this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,program);
  bVar2 = ShaderStorageBufferObjectBase::CheckProgram
                    (&this->super_ShaderStorageBufferObjectBase,this->m_program);
  uVar11 = 0xffffffffffffffff;
  if (bVar2) {
    local_1c8 = this->m_buffer;
    glu::CallLogWrapper::glGenBuffers(this_00,4,local_1c8);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x8a11,0,*local_1c8);
    glu::CallLogWrapper::glBufferData(this_00,0x8a11,lStack_1f0 - (long)local_1f8,local_1f8,0x88e4);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_buffer[1]);
    glu::CallLogWrapper::glBufferData
              (this_00,0x90d2,local_1d8 - (long)pvStack_1e0,pvStack_1e0,0x88e4);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_218,
               lStack_1f0 - (long)local_1f8,&local_219);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,this->m_buffer[2]);
    glu::CallLogWrapper::glBufferData
              (this_00,0x90d2,lStack_1f0 - (long)local_1f8,local_218._M_dataplus._M_p,0x88e4);
    if (local_218._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_218._M_dataplus._M_p,
                      local_218.field_2._M_allocated_capacity - (long)local_218._M_dataplus._M_p);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_218,
               local_1d8 - (long)pvStack_1e0,&local_219);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,2,this->m_buffer[3]);
    glu::CallLogWrapper::glBufferData
              (this_00,0x90d2,local_1d8 - (long)pvStack_1e0,local_218._M_dataplus._M_p,0x88e4);
    if (local_218._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_218._M_dataplus._M_p,
                      local_218.field_2._M_allocated_capacity - (long)local_218._M_dataplus._M_p);
    }
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    location = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_index1");
    glu::CallLogWrapper::glUniform1i(this_00,location,1);
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
    lVar5 = 2;
    bVar10 = 1;
    bVar2 = true;
    local_1c0 = this_00;
    do {
      bVar1 = bVar2;
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,local_1c8[lVar5]);
      glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
      pvVar6 = glu::CallLogWrapper::glMapBufferRange
                         (this_00,0x90d2,0,(long)ppvVar8[1] - (long)*ppvVar8,1);
      if (pvVar6 == (void *)0x0) break;
      pvVar7 = *ppvVar8;
      pvVar9 = ppvVar8[1];
      if (pvVar9 != pvVar7) {
        uVar11 = 0;
        do {
          if (*(char *)((long)pvVar7 + uVar11) != *(char *)((long)pvVar6 + uVar11)) {
            anon_unknown_0::Output("Byte at index %3d is %2x should be %2x.\n",uVar11 & 0xffffffff);
            pvVar7 = *ppvVar8;
            pvVar9 = ppvVar8[1];
            bVar10 = 0;
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 < (ulong)((long)pvVar9 - (long)pvVar7));
      }
      this_00 = local_1c0;
      glu::CallLogWrapper::glUnmapBuffer(local_1c0,0x90d2);
      lVar5 = 3;
      ppvVar8 = &pvStack_1e0;
      bVar2 = false;
    } while (bVar1);
    uVar11 = -(ulong)(pvVar6 == (void *)0x0) | -(ulong)(~bVar10 & 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  lVar5 = 0x30;
  do {
    pvVar6 = *(void **)((long)&local_218._M_string_length + lVar5);
    if (pvVar6 != (void *)0x0) {
      operator_delete(pvVar6,*(long *)((long)&local_218.field_2 + lVar5 + 8) - (long)pvVar6);
    }
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != 0);
  return uVar11;
}

Assistant:

virtual long Run()
	{
		std::vector<GLubyte> in_data[2];

		std::stringstream ss;
		ss << "layout(local_size_x = 1) in;\n" << GetInput(in_data);
		m_program = CreateProgramCS(ss.str());
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(4, m_buffer);

		// input buffers
		glBindBufferBase(GL_UNIFORM_BUFFER, 0, m_buffer[0]);
		glBufferData(GL_UNIFORM_BUFFER, (GLsizeiptr)in_data[0].size(), &in_data[0][0], GL_STATIC_DRAW);

		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer[1]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)in_data[1].size(), &in_data[1][0], GL_STATIC_DRAW);

		/* output buffer 0 */
		{
			std::vector<GLubyte> out_data(in_data[0].size());
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_buffer[2]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)in_data[0].size(), &out_data[0], GL_STATIC_DRAW);
		}
		/* output buffer 1 */
		{
			std::vector<GLubyte> out_data(in_data[1].size());
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 2, m_buffer[3]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)in_data[1].size(), &out_data[0], GL_STATIC_DRAW);
		}

		glUseProgram(m_program);
		glUniform1i(glGetUniformLocation(m_program, "g_index1"), 1);
		glDispatchCompute(1, 1, 1);

		bool status = true;
		for (int j = 0; j < 2; ++j)
		{
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_buffer[j + 2]);
			glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
			GLubyte* out_data =
				(GLubyte*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, (GLsizeiptr)in_data[j].size(), GL_MAP_READ_BIT);
			if (!out_data)
				return ERROR;

			for (size_t i = 0; i < in_data[j].size(); ++i)
			{
				if (in_data[j][i] != out_data[i])
				{
					Output("Byte at index %3d is %2x should be %2x.\n", static_cast<int>(i), out_data[i],
						   in_data[j][i]);
					status = false;
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}
		if (!status)
			return ERROR;
		return NO_ERROR;
	}